

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void yy_destructor(yyParser *yypParser,uchar yymajor,YYMINORTYPE *yypminor)

{
  sqlite3 *db;
  Select *p;
  SrcList *in_RDX;
  byte in_SIL;
  long in_RDI;
  Parse *pParse;
  undefined7 in_stack_fffffffffffffff0;
  
  db = *(sqlite3 **)(in_RDI + 8);
  p = (Select *)(ulong)(in_SIL - 0xa3);
  switch(p) {
  case (Select *)0x0:
  case (Select *)0x20:
  case (Select *)0x21:
  case (Select *)0x2c:
    sqlite3SelectDelete(db,p);
    break;
  default:
    break;
  case (Select *)0xb:
  case (Select *)0xc:
    sqlite3ExprDelete(db,(Expr *)p);
    break;
  case (Select *)0x10:
  case (Select *)0x19:
  case (Select *)0x25:
  case (Select *)0x28:
  case (Select *)0x2a:
  case (Select *)0x2d:
  case (Select *)0x2e:
  case (Select *)0x2f:
  case (Select *)0x39:
  case (Select *)0x3a:
  case (Select *)0x41:
    sqlite3ExprListDelete((sqlite3 *)CONCAT17(in_SIL,in_stack_fffffffffffffff0),(ExprList *)in_RDX);
    break;
  case (Select *)0x1f:
  case (Select *)0x26:
  case (Select *)0x31:
  case (Select *)0x32:
    sqlite3SrcListDelete((sqlite3 *)CONCAT17(in_SIL,in_stack_fffffffffffffff0),in_RDX);
    break;
  case (Select *)0x22:
  case (Select *)0x59:
    sqlite3WithDelete((sqlite3 *)CONCAT17(in_SIL,in_stack_fffffffffffffff0),(With *)in_RDX);
    break;
  case (Select *)0x27:
  case (Select *)0x29:
  case (Select *)0x35:
  case (Select *)0x40:
  case (Select *)0x42:
  case (Select *)0x4b:
  case (Select *)0x50:
    sqlite3ExprDelete(db,(Expr *)p);
    break;
  case (Select *)0x36:
  case (Select *)0x38:
  case (Select *)0x3c:
    sqlite3IdListDelete(db,(IdList *)p);
    break;
  case (Select *)0x47:
  case (Select *)0x4c:
    sqlite3DeleteTriggerStep(db,(TriggerStep *)p);
    break;
  case (Select *)0x49:
    sqlite3IdListDelete(db,(IdList *)p);
  }
  return;
}

Assistant:

static void yy_destructor(
  yyParser *yypParser,    /* The parser */
  YYCODETYPE yymajor,     /* Type code for object to destroy */
  YYMINORTYPE *yypminor   /* The object to be destroyed */
){
  sqlite3ParserARG_FETCH;
  switch( yymajor ){
    /* Here is inserted the actions which take place when a
    ** terminal or non-terminal is destroyed.  This can happen
    ** when the symbol is popped from the stack during a
    ** reduce or during error processing or when a parser is 
    ** being destroyed before it is finished parsing.
    **
    ** Note: during a reduce, the only symbols destroyed are those
    ** which appear on the RHS of the rule, but which are not used
    ** inside the C code.
    */
    case 163: /* select */
    case 195: /* selectnowith */
    case 196: /* oneselect */
    case 207: /* values */
{
sqlite3SelectDelete(pParse->db, (yypminor->yy3));
}
      break;
    case 174: /* term */
    case 175: /* expr */
{
sqlite3ExprDelete(pParse->db, (yypminor->yy346).pExpr);
}
      break;
    case 179: /* idxlist_opt */
    case 188: /* idxlist */
    case 200: /* selcollist */
    case 203: /* groupby_opt */
    case 205: /* orderby_opt */
    case 208: /* nexprlist */
    case 209: /* exprlist */
    case 210: /* sclp */
    case 220: /* sortlist */
    case 221: /* setlist */
    case 228: /* case_exprlist */
{
sqlite3ExprListDelete(pParse->db, (yypminor->yy14));
}
      break;
    case 194: /* fullname */
    case 201: /* from */
    case 212: /* seltablist */
    case 213: /* stl_prefix */
{
sqlite3SrcListDelete(pParse->db, (yypminor->yy65));
}
      break;
    case 197: /* with */
    case 252: /* wqlist */
{
sqlite3WithDelete(pParse->db, (yypminor->yy59));
}
      break;
    case 202: /* where_opt */
    case 204: /* having_opt */
    case 216: /* on_opt */
    case 227: /* case_operand */
    case 229: /* case_else */
    case 238: /* when_clause */
    case 243: /* key_opt */
{
sqlite3ExprDelete(pParse->db, (yypminor->yy132));
}
      break;
    case 217: /* using_opt */
    case 219: /* idlist */
    case 223: /* inscollist_opt */
{
sqlite3IdListDelete(pParse->db, (yypminor->yy408));
}
      break;
    case 234: /* trigger_cmd_list */
    case 239: /* trigger_cmd */
{
sqlite3DeleteTriggerStep(pParse->db, (yypminor->yy473));
}
      break;
    case 236: /* trigger_event */
{
sqlite3IdListDelete(pParse->db, (yypminor->yy378).b);
}
      break;
    default:  break;   /* If no destructor action specified: do nothing */
  }
}